

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::cpp::MessageGenerator::NeedsIsInitialized(MessageGenerator *this)

{
  pointer ppFVar1;
  char cVar2;
  bool bVar3;
  FieldGenerator *pFVar4;
  FieldDescriptor *field;
  Options *in_RCX;
  pointer ppFVar5;
  Iterator __begin4;
  Iterator __end4;
  Iterator __begin3;
  Iterator __end3;
  Iterator local_80;
  Iterator local_70;
  string local_60;
  Iterator local_40;
  
  SimpleBaseClass_abi_cxx11_
            (&local_60,(cpp *)this->descriptor_,(Descriptor *)&this->options_,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(int)local_60._M_dataplus._M_p) !=
      &local_60.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_60._M_dataplus._M_p._4_4_,(int)local_60._M_dataplus._M_p),
                    local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_60._M_string_length == 0) {
    if (this->num_required_fields_ != 0 || *(int *)(this->descriptor_ + 0x88) != 0) {
      return true;
    }
    ppFVar5 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar5 != ppFVar1) {
      do {
        pFVar4 = FieldGeneratorTable::get(&this->field_generators_,*ppFVar5);
        cVar2 = (**(code **)((long)((pFVar4->impl_)._M_t.
                                    super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                    .
                                    super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>
                                   ._M_head_impl)->_vptr_FieldGeneratorBase + 0xd8))();
        if (cVar2 != '\0') {
          return true;
        }
        ppFVar5 = ppFVar5 + 1;
      } while (ppFVar5 != ppFVar1);
    }
    if (this->num_weak_fields_ != 0) {
      return true;
    }
    local_60._M_string_length = (size_type)this->descriptor_;
    local_60._M_dataplus._M_p._0_4_ = 0;
    local_40.idx = *(int *)(local_60._M_string_length + 0x7c);
    local_40.descriptor = (Descriptor *)local_60._M_string_length;
    bVar3 = cpp::operator==((Iterator *)&local_60,&local_40);
    if (!bVar3) {
      do {
        local_80.descriptor = OneOfRangeImpl::Iterator::operator*((Iterator *)&local_60);
        local_80.idx = 0;
        local_70.idx = *(int *)(local_80.descriptor + 4);
        local_70.descriptor = local_80.descriptor;
        while (bVar3 = protobuf::internal::operator==(&local_80,&local_70), !bVar3) {
          field = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::
                  operator*(&local_80);
          pFVar4 = FieldGeneratorTable::get(&this->field_generators_,field);
          cVar2 = (**(code **)((long)((pFVar4->impl_)._M_t.
                                      super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                      .
                                      super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>
                                     ._M_head_impl)->_vptr_FieldGeneratorBase + 0xd8))();
          if (cVar2 != '\0') {
            return true;
          }
          local_80.idx = local_80.idx + 1;
        }
        local_60._M_dataplus._M_p._0_4_ = (int)local_60._M_dataplus._M_p + 1;
        bVar3 = cpp::operator==((Iterator *)&local_60,&local_40);
      } while (!bVar3);
    }
  }
  return false;
}

Assistant:

bool MessageGenerator::NeedsIsInitialized() {
  if (HasSimpleBaseClass(descriptor_, options_)) return false;
  if (descriptor_->extension_range_count() != 0) return true;
  if (num_required_fields_ != 0) return true;

  for (const auto* field : optimized_order_) {
    if (field_generators_.get(field).NeedsIsInitialized()) return true;
  }
  if (num_weak_fields_ != 0) return true;

  for (const auto* oneof : OneOfRange(descriptor_)) {
    for (const auto* field : FieldRange(oneof)) {
      if (field_generators_.get(field).NeedsIsInitialized()) return true;
    }
  }

  return false;
}